

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QSqlError * qMakeError(sqlite3 *access,QString *descr,ErrorType type,int errorCode)

{
  QChar *pQVar1;
  ErrorType in_ECX;
  sqlite3 *in_RDX;
  QSqlError *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QChar *)sqlite3_errmsg16(in_RDX);
  QString::QString(&local_20,pQVar1,-1);
  QString::number((int)local_38,in_R8D);
  QSqlError::QSqlError(in_RDI,(QString *)in_RDX,(QString *)&local_20,in_ECX,(QString *)local_38);
  QString::~QString((QString *)0x115440);
  QString::~QString((QString *)0x11544a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QSqlError qMakeError(sqlite3 *access, const QString &descr, QSqlError::ErrorType type,
                            int errorCode)
{
    return QSqlError(descr,
                     QString(reinterpret_cast<const QChar *>(sqlite3_errmsg16(access))),
                     type, QString::number(errorCode));
}